

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequence_lexicon.h
# Opt level: O2

void __thiscall
SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::SequenceLexicon
          (SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_> *this,
          SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_> *x)

{
  dense_hashtable_const_iterator<unsigned_int,_unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_gtl::dense_hash_set<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>::Identity,_gtl::dense_hash_set<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>::SetKey,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>
  f;
  dense_hashtable_const_iterator<unsigned_int,_unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_gtl::dense_hash_set<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>::Identity,_gtl::dense_hash_set<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>::SetKey,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>
  l;
  allocator_type local_69;
  const_iterator local_68;
  const_iterator local_50;
  key_equal local_38;
  hasher local_28;
  
  std::vector<int,_std::allocator<int>_>::vector(&this->values_,&x->values_);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->begins_,&x->begins_);
  gtl::
  dense_hashtable<unsigned_int,_unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_gtl::dense_hash_set<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>::Identity,_gtl::dense_hash_set<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>::SetKey,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>
  ::begin(&local_50,&(x->id_set_).rep);
  gtl::
  dense_hashtable<unsigned_int,_unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_gtl::dense_hash_set<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>::Identity,_gtl::dense_hash_set<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>::SetKey,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>
  ::end(&local_68,&(x->id_set_).rep);
  f.pos = local_50.pos;
  f.ht = local_50.ht;
  f.end = local_50.end;
  l.pos = local_68.pos;
  l.ht = local_68.ht;
  l.end = local_68.end;
  local_38.lexicon_ = this;
  local_28.lexicon_ = this;
  gtl::
  dense_hash_set<unsigned_int,SequenceLexicon<int,std::hash<int>,std::equal_to<int>>::IdHasher,SequenceLexicon<int,std::hash<int>,std::equal_to<int>>::IdKeyEqual,std::allocator<unsigned_int>>
  ::
  dense_hash_set<gtl::dense_hashtable_const_iterator<unsigned_int,unsigned_int,SequenceLexicon<int,std::hash<int>,std::equal_to<int>>::IdHasher,gtl::dense_hash_set<unsigned_int,SequenceLexicon<int,std::hash<int>,std::equal_to<int>>::IdHasher,SequenceLexicon<int,std::hash<int>,std::equal_to<int>>::IdKeyEqual,std::allocator<unsigned_int>>::Identity,gtl::dense_hash_set<unsigned_int,SequenceLexicon<int,std::hash<int>,std::equal_to<int>>::IdHasher,SequenceLexicon<int,std::hash<int>,std::equal_to<int>>::IdKeyEqual,std::allocator<unsigned_int>>::SetKey,SequenceLexicon<int,std::hash<int>,std::equal_to<int>>::IdKeyEqual,std::allocator<unsigned_int>>>
            ((dense_hash_set<unsigned_int,SequenceLexicon<int,std::hash<int>,std::equal_to<int>>::IdHasher,SequenceLexicon<int,std::hash<int>,std::equal_to<int>>::IdKeyEqual,std::allocator<unsigned_int>>
              *)&this->id_set_,f,l,&kEmptyKey,0,&local_28,&local_38,&local_69);
  return;
}

Assistant:

SequenceLexicon<T, Hasher, KeyEqual>::SequenceLexicon(const SequenceLexicon& x)
    : values_(x.values_), begins_(x.begins_),
      // Unfortunately we can't copy "id_set_" because we need to change the
      // "this" pointers associated with hasher() and key_equal().
      id_set_(x.id_set_.begin(), x.id_set_.end(), kEmptyKey, 0,
              IdHasher(x.id_set_.hash_funct().hasher(), this),
              IdKeyEqual(x.id_set_.key_eq().key_equal(), this)) {
}